

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Nullability __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Nullability nullability)

{
  uint32_t uVar1;
  Nullability NVar2;
  
  NVar2 = NonNullable;
  if (nullability != NonNullable) {
    if ((((byte)this->wasm[0x179] & 4) != 0) && (uVar1 = Random::upTo(&this->random,2), uVar1 == 0))
    {
      return NonNullable;
    }
    NVar2 = Nullable;
  }
  return NVar2;
}

Assistant:

Nullability TranslateToFuzzReader::getSubType(Nullability nullability) {
  if (nullability == NonNullable) {
    return NonNullable;
  }
  return getNullability();
}